

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-io.cpp
# Opt level: O0

void __thiscall wasm::ModuleReader::readText(ModuleReader *this,string *filename,Module *wasm)

{
  bool bVar1;
  ostream *poVar2;
  BinaryOption in_ECX;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined1 local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  Module *wasm_local;
  string *filename_local;
  ModuleReader *this_local;
  
  input.field_2._8_8_ = wasm;
  bVar1 = isDebugEnabled("writer");
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"reading text from ");
    poVar2 = std::operator<<(poVar2,(string *)filename);
    std::operator<<(poVar2,"\n");
  }
  read_file<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (wasm *)filename,(string *)0x1,in_ECX);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_68,filename);
  readTextData(&local_68,(string *)local_40,(Module *)input.field_2._8_8_,*(IRProfile *)(this + 4));
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_68);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void ModuleReader::readText(std::string filename, Module& wasm) {
  BYN_TRACE("reading text from " << filename << "\n");
  auto input(read_file<std::string>(filename, Flags::Text));
  readTextData(filename, input, wasm, profile);
}